

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_36ca0::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  size_t *psVar4;
  unsigned_short *puVar5;
  size_t sVar6;
  ushort *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  bool bVar19;
  half candidate [16];
  ushort local_58 [20];
  
  uVar14 = this->_startValue;
  if (uVar14 < this->_endValue) {
    sVar6 = this->_numElements;
    psVar4 = this->_offset;
    puVar5 = this->_elements;
    do {
      uVar2 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)uVar14 & 0xff];
      uVar3 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)(uVar14 >> 8) & 0xff];
      psVar4[uVar14 - this->_startValue] = sVar6;
      uVar17 = (uint)uVar3 + (uint)uVar2;
      if (uVar17 == 0) {
        sVar6 = this->_numElements;
        sVar18 = 0;
      }
      else {
        sVar18 = (size_t)uVar17;
        uVar8 = 0;
        uVar11 = 0;
        uVar10 = uVar17;
        do {
          uVar10 = uVar10 - 1;
          uVar13 = 0;
          bVar15 = 0;
          do {
            bVar19 = (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                     countSetBits(unsigned_short)::numBitsSet)
                                   [uVar13 >> 8 & 0xffffff] +
                     (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                     countSetBits(unsigned_short)::numBitsSet)[uVar13 & 0xff] ==
                     uVar10;
            uVar16 = uVar11;
            if (bVar19) {
              uVar16 = (uint)uVar13;
            }
            if ((bool)(bVar19 & bVar15)) {
              fVar1 = *(float *)(_imath_half_to_float_table + (uVar14 & 0xffff) * 4);
              bVar15 = 1;
              if (ABS(fVar1 - *(float *)(_imath_half_to_float_table + uVar13 * 4)) <
                  ABS(fVar1 - *(float *)(_imath_half_to_float_table + (ulong)(uVar11 & 0xffff) * 4))
                 ) {
                uVar11 = (uint)uVar13;
              }
            }
            else {
              bVar15 = bVar15 | bVar19;
              uVar11 = uVar16;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != 0x10000);
          local_58[uVar8] = (ushort)uVar11;
          uVar8 = uVar8 + 1;
        } while (uVar8 != sVar18);
        puVar7 = local_58;
        uVar8 = sVar18;
        uVar13 = 0;
        do {
          uVar9 = uVar13 + 1;
          if (uVar9 < sVar18) {
            uVar12 = 1;
            do {
              uVar2 = local_58[uVar13];
              uVar3 = puVar7[uVar12];
              if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar3 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar3 & 0xff] <
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 & 0xff]) {
                local_58[uVar13] = uVar3;
                puVar7[uVar12] = uVar2;
              }
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
          puVar7 = puVar7 + 1;
          uVar8 = uVar8 - 1;
          uVar13 = uVar9;
        } while (uVar9 != sVar18);
        sVar6 = this->_numElements;
        memcpy(puVar5 + sVar6,local_58,(ulong)(uVar17 * 2));
        sVar6 = sVar6 + (uVar17 - 1) + 1;
        this->_numElements = sVar6;
      }
      if (uVar14 == this->_endValue - 1) {
        this->_lastCandidateCount = sVar18;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < this->_endValue);
  }
  return;
}

Assistant:

void run (bool outputProgress)
    {
        half candidate[16];
        int  candidateCount = 0;

        for (size_t input = _startValue; input < _endValue; ++input)
        {

            int  numSetBits = countSetBits (input);
            half inputHalf, closestHalf;

            inputHalf.setBits (input);
            closestHalf.setBits (0);

            _offset[input - _startValue] = _numElements;

            // Gather candidates
            candidateCount = 0;
            for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
                 --targetNumSetBits)
            {
                bool valueFound = false;

                for (int i = 0; i < 65536; ++i)
                {
                    if (countSetBits (i) != targetNumSetBits) continue;

                    if (!valueFound)
                    {
                        closestHalf.setBits (i);
                        valueFound = true;
                    }
                    else
                    {
                        half tmpHalf;

                        tmpHalf.setBits (i);

                        if (fabs ((float) inputHalf - (float) tmpHalf) <
                            fabs ((float) inputHalf - (float) closestHalf))
                        {
                            closestHalf = tmpHalf;
                        }
                    }
                }

                candidate[candidateCount] = closestHalf;
                candidateCount++;
            }

            // Sort candidates by increasing number of bits set
            for (int i = 0; i < candidateCount; ++i)
            {
                for (int j = i + 1; j < candidateCount; ++j)
                {

                    int iCnt = countSetBits (candidate[i].bits ());
                    int jCnt = countSetBits (candidate[j].bits ());

                    if (jCnt < iCnt)
                    {
                        half tmp     = candidate[i];
                        candidate[i] = candidate[j];
                        candidate[j] = tmp;
                    }
                }
            }

            // Copy candidates to the data buffer;
            for (int i = 0; i < candidateCount; ++i)
            {
                _elements[_numElements] = candidate[i].bits ();
                _numElements++;
            }

            if (input == _endValue - 1)
            {
                _lastCandidateCount = candidateCount;
            }
        }
    }